

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  int *piVar1;
  ImDrawCmd *pIVar2;
  float fVar3;
  char cVar4;
  ushort uVar5;
  ImDrawVert *pIVar6;
  unsigned_short *puVar7;
  bool bVar8;
  ImGuiContext *pIVar9;
  ImDrawIdx *pIVar10;
  ImDrawVert *pIVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  char *pcVar15;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  Glyph *pGVar16;
  long lVar17;
  int iVar18;
  char *pcVar19;
  char *pcVar20;
  ImDrawIdx IVar21;
  char *pcVar22;
  char *pcVar23;
  int iVar24;
  char *pcVar25;
  float fVar26;
  undefined1 auVar27 [4];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  uint c;
  float local_b4;
  uint local_a4;
  ImVec4 *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  ImDrawIdx *local_80;
  ImDrawVert *local_78;
  int local_70;
  int local_6c;
  ImU32 local_68;
  float local_64;
  ulong local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [4];
  undefined1 auStack_44 [8];
  float fStack_3c;
  
  auVar27 = (undefined1  [4])pos.x;
  fVar26 = pos.y;
  local_68 = col;
  if (text_end == (char *)0x0) {
    auStack_44._4_4_ = in_XMM1_Dc;
    _local_48 = pos;
    fStack_3c = in_XMM1_Dd;
    sVar14 = strlen(text_begin);
    text_end = text_begin + sVar14;
    auVar27 = local_48;
    fVar26 = (float)auStack_44._0_4_;
    in_XMM1_Dc = (float)auStack_44._4_4_;
    in_XMM1_Dd = fStack_3c;
  }
  fStack_94 = (float)(int)fVar26;
  fStack_90 = (float)(int)fVar26;
  fStack_8c = (float)(int)fVar26;
  local_98 = (float)(int)fVar26 + (this->DisplayOffset).y;
  if (local_98 < clip_rect->w || local_98 == clip_rect->w) {
    fStack_54 = (float)(int)fVar26;
    fStack_50 = (float)(int)in_XMM1_Dc;
    fStack_4c = (float)(int)in_XMM1_Dd;
    fVar26 = size / this->FontSize;
    fVar31 = this->FontSize * fVar26;
    pcVar25 = text_begin;
    if ((wrap_width <= 0.0) && (text_begin < text_end && local_98 + fVar31 < clip_rect->y)) {
      do {
        pcVar25 = text_begin;
        if (*text_begin == '\n') break;
        text_begin = text_begin + 1;
        pcVar25 = text_end;
      } while (text_begin != text_end);
    }
    local_58 = (float)(int)(float)auVar27 + (this->DisplayOffset).x;
    iVar12 = (int)text_end - (int)pcVar25;
    local_6c = iVar12 * 6;
    local_70 = (draw_list->IdxBuffer).Size;
    local_a0 = clip_rect;
    ImDrawList::PrimReserve(draw_list,local_6c,iVar12 * 4);
    local_78 = draw_list->_VtxWritePtr;
    local_80 = draw_list->_IdxWritePtr;
    local_60 = (ulong)draw_list->_VtxCurrentIdx;
    pcVar15 = (char *)0x0;
    fVar32 = local_58;
    fVar39 = local_58;
    auVar27 = (undefined1  [4])local_98;
    fVar28 = fStack_94;
    fVar29 = fStack_90;
    fVar30 = fStack_8c;
    fVar3 = local_64;
    fVar37 = local_58;
    pcVar22 = (char *)0x0;
    pcVar19 = pcVar25;
joined_r0x00150339:
    do {
      local_64 = fVar32;
      if (text_end <= pcVar25) break;
      pcVar20 = pcVar19;
      pcVar23 = pcVar22;
      local_b4 = fVar37;
      fVar32 = local_98;
      fVar36 = fStack_94;
      fVar35 = fStack_90;
      fVar33 = fStack_8c;
      if (0.0 < wrap_width) {
        local_b4 = local_64;
        if (pcVar15 == (char *)0x0) {
          local_48 = auVar27;
          pcVar15 = CalcWordWrapPositionA
                              (this,fVar26,pcVar25,text_end,(fVar39 - local_64) + wrap_width);
          fVar28 = 0.0;
          fVar29 = 0.0;
          fVar30 = 0.0;
          pcVar15 = pcVar15 + (pcVar15 == pcVar25);
          auVar27 = local_48;
          local_b4 = local_64;
          fVar39 = local_58;
          fVar3 = local_64;
        }
        local_64 = fVar3;
        pcVar20 = pcVar25;
        pcVar23 = pcVar15;
        fVar32 = (float)auVar27;
        fVar36 = fVar28;
        fVar35 = fVar29;
        fVar33 = fVar30;
        fVar3 = local_64;
        if (pcVar15 <= pcVar25) {
          do {
            if (text_end <= pcVar25) break;
            cVar4 = *pcVar25;
            pcVar25 = pcVar25 + ((byte)(cVar4 - 9U) < 2 || cVar4 == ' ');
          } while ((cVar4 == ' ') || (cVar4 == '\t'));
          pcVar15 = (char *)0x0;
          fVar32 = fVar39;
          auVar27 = (undefined1  [4])((float)auVar27 + fVar31);
          goto joined_r0x00150339;
        }
      }
      local_64 = fVar3;
      fStack_8c = fVar33;
      fStack_90 = fVar35;
      fStack_94 = fVar36;
      local_98 = fVar32;
      local_a4 = (uint)*pcVar20;
      if (*pcVar20 < '\0') {
        uVar13 = ImTextCharFromUtf8(&local_a4,pcVar20,text_end);
        pcVar20 = pcVar20 + uVar13;
        fVar39 = local_58;
        if (local_a4 != 0) goto LAB_0015046d;
        bVar8 = true;
        pcVar25 = pcVar20;
        fVar37 = local_b4;
      }
      else {
        pcVar20 = pcVar20 + 1;
LAB_0015046d:
        pcVar25 = pcVar20;
        if (local_a4 < 0x20) {
          if (local_a4 != 0xd) {
            if (local_a4 == 10) {
              local_98 = local_98 + fVar31;
              bVar8 = true;
              fVar37 = fVar39;
              if (local_98 < local_a0->w || local_98 == local_a0->w) {
                if (wrap_width <= 0.0) {
                  bVar8 = false;
                  if ((fVar31 + local_98 < local_a0->y) && (pcVar20 < text_end)) {
                    lVar17 = (long)text_end - (long)pcVar20;
                    do {
                      if (*pcVar20 == '\n') goto LAB_001504b2;
                      pcVar20 = pcVar20 + 1;
                      bVar8 = false;
                      lVar17 = lVar17 + -1;
                      pcVar25 = text_end;
                    } while (lVar17 != 0);
                  }
                }
                else {
LAB_001504b2:
                  bVar8 = false;
                  pcVar25 = pcVar20;
                }
              }
              goto LAB_0015060b;
            }
            goto LAB_001504bd;
          }
        }
        else {
LAB_001504bd:
          if (((int)(local_a4 & 0xffff) < (this->IndexLookup).Size) &&
             (uVar5 = (this->IndexLookup).Data[local_a4 & 0xffff], uVar5 != 0xffff)) {
            pGVar16 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint +
                               (ulong)((uint)uVar5 * 0x28));
          }
          else {
            pGVar16 = this->FallbackGlyph;
          }
          bVar8 = true;
          if (pGVar16 == (Glyph *)0x0) {
            fVar28 = 0.0;
          }
          else {
            fVar28 = pGVar16->XAdvance * fVar26;
            if ((local_a4 != 9) && (local_a4 != 0x20)) {
              fVar30 = pGVar16->X0 * fVar26 + local_b4;
              fVar29 = local_a0->z;
              if (fVar30 <= fVar29) {
                fVar37 = pGVar16->X1 * fVar26 + local_b4;
                fVar3 = local_a0->x;
                if (fVar3 <= fVar37) {
                  fVar38 = pGVar16->Y0 * fVar26 + local_98;
                  fVar34 = pGVar16->Y1 * fVar26 + local_98;
                  fVar32 = pGVar16->U0;
                  fVar36 = pGVar16->V0;
                  fVar35 = pGVar16->U1;
                  fVar33 = pGVar16->V1;
                  if (cpu_fine_clip) {
                    if (fVar30 < fVar3) {
                      fVar32 = fVar32 + (fVar35 - fVar32) *
                                        (1.0 - (fVar37 - fVar3) / (fVar37 - fVar30));
                      fVar30 = fVar3;
                    }
                    fVar3 = local_a0->y;
                    if (fVar38 < fVar3) {
                      fVar36 = fVar36 + (fVar33 - fVar36) *
                                        (1.0 - (fVar34 - fVar3) / (fVar34 - fVar38));
                      fVar38 = fVar3;
                    }
                    if (fVar29 < fVar37) {
                      fVar35 = (fVar35 - fVar32) * ((fVar29 - fVar30) / (fVar37 - fVar30)) + fVar32;
                      fVar37 = fVar29;
                    }
                    fVar29 = local_a0->w;
                    if (fVar29 < fVar34) {
                      fVar33 = (fVar33 - fVar36) * ((fVar29 - fVar38) / (fVar34 - fVar38)) + fVar36;
                      fVar34 = fVar29;
                    }
                    if (fVar34 <= fVar38) {
                      local_b4 = local_b4 + fVar28;
                      bVar8 = false;
                      goto LAB_001505f0;
                    }
                  }
                  IVar21 = (ImDrawIdx)local_60;
                  *local_80 = IVar21;
                  local_80[1] = IVar21 + 1;
                  local_80[2] = IVar21 + 2;
                  local_80[3] = IVar21;
                  local_80[4] = IVar21 + 2;
                  local_80[5] = IVar21 + 3;
                  (local_78->pos).x = fVar30;
                  (local_78->pos).y = fVar38;
                  local_78->col = local_68;
                  (local_78->uv).x = fVar32;
                  (local_78->uv).y = fVar36;
                  local_78[1].pos.x = fVar37;
                  local_78[1].pos.y = fVar38;
                  local_78[1].col = local_68;
                  local_78[1].uv.x = fVar35;
                  local_78[1].uv.y = fVar36;
                  local_78[2].pos.x = fVar37;
                  local_78[2].pos.y = fVar34;
                  local_78[2].col = local_68;
                  local_78[2].uv.x = fVar35;
                  local_78[2].uv.y = fVar33;
                  local_78[3].pos.x = fVar30;
                  local_78[3].pos.y = fVar34;
                  local_78[3].col = local_68;
                  local_78[3].uv.x = fVar32;
                  local_78[3].uv.y = fVar33;
                  local_78 = local_78 + 4;
                  local_60 = (ulong)((int)local_60 + 4);
                  local_80 = local_80 + 6;
                }
              }
            }
          }
LAB_001505f0:
          if (bVar8) {
            local_b4 = local_b4 + fVar28;
          }
        }
        bVar8 = false;
        fVar37 = local_b4;
      }
LAB_0015060b:
      fVar3 = local_64;
      pcVar15 = pcVar23;
      fVar32 = fVar37;
      auVar27 = (undefined1  [4])local_98;
      fVar28 = fStack_94;
      fVar29 = fStack_90;
      fVar30 = fStack_8c;
      pcVar22 = pcVar23;
      pcVar19 = pcVar25;
    } while (!bVar8);
    local_64 = fVar3;
    pIVar11 = local_78;
    pIVar10 = local_80;
    pIVar9 = GImGui;
    iVar24 = (int)((ulong)((long)local_78 - (long)(draw_list->VtxBuffer).Data) >> 2);
    iVar18 = iVar24 * -0x33333333;
    iVar12 = (draw_list->VtxBuffer).Capacity;
    if (SBORROW4(iVar12,iVar18) != iVar12 + iVar24 * 0x33333333 < 0) {
      if (iVar12 == 0) {
        iVar24 = 8;
      }
      else {
        iVar24 = iVar12 / 2 + iVar12;
      }
      if (iVar24 <= iVar18) {
        iVar24 = iVar18;
      }
      if (iVar12 < iVar24) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (ImDrawVert *)(*(pIVar9->IO).MemAllocFn)((long)iVar24 * 0x14);
        pIVar6 = (draw_list->VtxBuffer).Data;
        if (pIVar6 != (ImDrawVert *)0x0) {
          memcpy(__dest,pIVar6,(long)(draw_list->VtxBuffer).Size * 0x14);
        }
        pIVar6 = (draw_list->VtxBuffer).Data;
        if (pIVar6 != (ImDrawVert *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar6);
        (draw_list->VtxBuffer).Data = __dest;
        (draw_list->VtxBuffer).Capacity = iVar24;
      }
    }
    (draw_list->VtxBuffer).Size = iVar18;
    pIVar9 = GImGui;
    iVar12 = (draw_list->IdxBuffer).Capacity;
    iVar24 = (int)((ulong)((long)pIVar10 - (long)(draw_list->IdxBuffer).Data) >> 1);
    if (iVar12 < iVar24) {
      if (iVar12 == 0) {
        iVar18 = 8;
      }
      else {
        iVar18 = iVar12 / 2 + iVar12;
      }
      if (iVar18 <= iVar24) {
        iVar18 = iVar24;
      }
      if (iVar12 < iVar18) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest_00 = (unsigned_short *)(*(pIVar9->IO).MemAllocFn)((long)iVar18 * 2);
        puVar7 = (draw_list->IdxBuffer).Data;
        if (puVar7 != (unsigned_short *)0x0) {
          memcpy(__dest_00,puVar7,(long)(draw_list->IdxBuffer).Size * 2);
        }
        puVar7 = (draw_list->IdxBuffer).Data;
        if (puVar7 != (unsigned_short *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(puVar7);
        (draw_list->IdxBuffer).Data = __dest_00;
        (draw_list->IdxBuffer).Capacity = iVar18;
      }
    }
    (draw_list->IdxBuffer).Size = iVar24;
    pIVar2 = (draw_list->CmdBuffer).Data + (long)(draw_list->CmdBuffer).Size + -1;
    pIVar2->ElemCount = pIVar2->ElemCount + (iVar24 - (local_6c + local_70));
    draw_list->_VtxWritePtr = pIVar11;
    draw_list->_IdxWritePtr = pIVar10;
    draw_list->_VtxCurrentIdx = (draw_list->VtxBuffer).Size;
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin);

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Skip non-visible lines
    const char* s = text_begin;
    if (!word_wrap_enabled && y + line_height < clip_rect.y)
        while (s < text_end && *s != '\n')  // Fast-forward to next line
            s++;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsSpace(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0)
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;

                if (y > clip_rect.w)
                    break;
                if (!word_wrap_enabled && y + line_height < clip_rect.y)
                    while (s < text_end && *s != '\n')  // Fast-forward to next line
                        s++;
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const Glyph* glyph = FindGlyph((unsigned short)c))
        {
            char_width = glyph->XAdvance * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug build.
                    // Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}